

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testvidinfo.c
# Opt level: O1

int RunBlitTests(SDL_Surface *screen,SDL_Surface *bmp,int blitcount)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  ulong local_38;
  
  iVar4 = (screen->w - bmp->w) + 1;
  iVar5 = (screen->h - bmp->h) + 1;
  local_38 = 0;
  do {
    iVar3 = blitcount;
    if (0 < blitcount) {
      do {
        if (iVar4 == 0) {
          local_40 = 0;
        }
        else {
          iVar1 = rand();
          local_40 = (undefined2)(iVar1 % iVar4);
        }
        if (iVar5 == 0) {
          local_3e = 0;
        }
        else {
          iVar1 = rand();
          local_3e = (undefined2)(iVar1 % iVar5);
        }
        local_3c = (undefined2)bmp->w;
        local_3a = (undefined2)bmp->h;
        SDL_UpperBlit(bmp,0,screen,&local_40);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    SDL_Flip(screen);
    uVar2 = (int)local_38 + 1;
    local_38 = (ulong)uVar2;
  } while (uVar2 != 500);
  return 500;
}

Assistant:

int RunBlitTests(SDL_Surface *screen, SDL_Surface *bmp, int blitcount)
{
	int i, j;
	int maxx;
	int maxy;
	SDL_Rect dst;

	maxx = (int)screen->w - bmp->w + 1;
	maxy = (int)screen->h - bmp->h + 1;
	for ( i = 0; i < NUM_UPDATES; ++i ) {
		for ( j = 0; j < blitcount; ++j ) {
			if ( maxx ) {
				dst.x = rand() % maxx;
			} else {
				dst.x = 0;
			}
			if ( maxy ) {
				dst.y = rand() % maxy;
			} else {
				dst.y = 0;
			}
			dst.w = bmp->w;
			dst.h = bmp->h;
			SDL_BlitSurface(bmp, NULL, screen, &dst);
		}
		SDL_Flip(screen);
	}

	return i;
}